

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

int64_t spvtools::opt::anon_unknown_15::CalculateGCDFromCoefficients
                  (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   *recurrences,int64_t running_gcd)

{
  pointer ppSVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  long b;
  pointer ppSVar4;
  
  ppSVar1 = (recurrences->
            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar4 = (recurrences->
                 super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar1;
      ppSVar4 = ppSVar4 + 1) {
    iVar3 = (*(*ppSVar4)->coefficient_->_vptr_SENode[4])();
    lVar2 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x30);
    b = -lVar2;
    if (0 < lVar2) {
      b = lVar2;
    }
    running_gcd = GreatestCommonDivisor(running_gcd,b);
  }
  return running_gcd;
}

Assistant:

int64_t CalculateGCDFromCoefficients(
    const std::vector<SERecurrentNode*>& recurrences, int64_t running_gcd) {
  for (SERecurrentNode* recurrence : recurrences) {
    auto coefficient = recurrence->GetCoefficient()->AsSEConstantNode();

    running_gcd = GreatestCommonDivisor(
        running_gcd, std::abs(coefficient->FoldToSingleValue()));
  }

  return running_gcd;
}